

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManPatDistImprove(Gia_Man_t *p,int fVerbose)

{
  Vec_Wrd_t *vPatterns_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  abctime aVar4;
  Vec_Int_t *vPat_00;
  Vec_Int_t *pVVar5;
  int *piVar6;
  abctime aVar7;
  double dVar8;
  double dVar9;
  int MaxIn;
  abctime clk;
  Vec_Wrd_t *vPatterns;
  Vec_Int_t *vStats;
  Vec_Int_t *vRes;
  Vec_Int_t *vPat;
  double FinalTotal;
  double FinalValue;
  double InitTotal;
  double InitValue;
  int nWords;
  int k;
  int n;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(p->vSimsPi);
  iVar2 = Gia_ManCiNum(p);
  iVar1 = iVar1 / iVar2;
  FinalValue = 0.0;
  vPat = (Vec_Int_t *)0x0;
  p_00 = Gia_SimGenerateStats(p);
  vPatterns_00 = p->vSimsPi;
  p->vSimsPi = (Vec_Wrd_t *)0x0;
  Abc_Random(1);
  nWords = 0;
  do {
    if (iVar1 * 0x40 <= nWords) {
      Vec_IntFree(p_00);
      if (fVerbose != 0) {
        printf("\n");
      }
      printf("Improved %d patterns with average init value %.2f and average final value %.2f.\n",
             (FinalValue * 1.0) / (double)(iVar1 << 6),((double)vPat * 1.0) / (double)(iVar1 << 6),
             (ulong)(uint)(iVar1 << 6));
      p->vSimsPi = vPatterns_00;
      return;
    }
    aVar4 = Abc_Clock();
    vPat_00 = Gia_ManPatCollectOne(p,vPatterns_00,nWords,iVar1);
    pVVar5 = Gia_SimQualityOne(p,vPat_00,0);
    dVar8 = Gia_SimComputeScore(p,p_00,pVVar5);
    FinalValue = dVar8 + FinalValue;
    Vec_IntFree(pVVar5);
    InitValue._4_4_ = 0;
    while (((int)InitValue._4_4_ < 100 &&
           (iVar2 = Gia_SimQualityPatternsMax(p,vPat_00,InitValue._4_4_,fVerbose,p_00), iVar2 != -1)
           )) {
      if ((iVar2 < 0) || (iVar3 = Gia_ManCiNum(p), iVar3 <= iVar2)) {
        __assert_fail("MaxIn >= 0 && MaxIn < Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x6db,"void Gia_ManPatDistImprove(Gia_Man_t *, int)");
      }
      piVar6 = Vec_IntArray(vPat_00);
      piVar6[iVar2] = piVar6[iVar2] ^ 1;
      InitValue._4_4_ = InitValue._4_4_ + 1;
    }
    pVVar5 = Gia_SimQualityOne(p,vPat_00,0);
    dVar9 = Gia_SimComputeScore(p,p_00,pVVar5);
    vPat = (Vec_Int_t *)(dVar9 + (double)vPat);
    Vec_IntFree(pVVar5);
    if (fVerbose != 0) {
      printf("Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ",dVar8,
             dVar9,dVar9 / dVar8,(ulong)(uint)nWords,(ulong)InitValue._4_4_);
      aVar7 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar7 - aVar4);
    }
    Gia_ManPatUpdateOne(p,vPatterns_00,nWords,iVar1,vPat_00);
    Vec_IntFree(vPat_00);
    nWords = nWords + 1;
  } while( true );
}

Assistant:

void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose )
{
    int n, k, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    double InitValue, InitTotal = 0, FinalValue, FinalTotal = 0;
    Vec_Int_t * vPat, * vRes, * vStats = Gia_SimGenerateStats( p );
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    Abc_Random(1);
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
//        if ( n == 32 )
//            break;

        vPat = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        vRes = Gia_SimQualityOne( p, vPat, 0 );
        InitValue = Gia_SimComputeScore(p, vStats, vRes);
        InitTotal += InitValue;
        Vec_IntFree( vRes );

        for ( k = 0; k < 100; k++ )
        {
            int MaxIn = Gia_SimQualityPatternsMax( p, vPat, k, fVerbose, vStats );
            if ( MaxIn == -1 )
                break;
            assert( MaxIn >= 0 && MaxIn < Gia_ManCiNum(p) );
            Vec_IntArray(vPat)[MaxIn] ^= 1;            
        }
        //Vec_IntPrint( vPat );

        vRes = Gia_SimQualityOne( p, vPat, 0 );
        FinalValue = Gia_SimComputeScore(p, vStats, vRes);
        FinalTotal += FinalValue;
        Vec_IntFree( vRes );

        if ( fVerbose )
        {
            printf( "Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ", 
                n, k, InitValue, FinalValue, FinalValue/InitValue );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }

        Gia_ManPatUpdateOne( p, vPatterns, n, nWords, vPat );
        Vec_IntFree( vPat );
    }
    Vec_IntFree( vStats );
    if ( fVerbose )
        printf( "\n" );
    printf( "Improved %d patterns with average init value %.2f and average final value %.2f.\n", 
        64*nWords, 1.0*InitTotal/(64*nWords), 1.0*FinalTotal/(64*nWords) );
    p->vSimsPi = vPatterns;
}